

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

void DecideOverLiteralContextModeling
               (uint8_t *input,size_t start_pos,size_t length,size_t mask,int quality,
               size_t size_hint,size_t *num_literal_contexts,uint32_t **literal_context_map)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  undefined1 auVar6 [16];
  size_t stride_end_pos;
  ulong uVar7;
  uint *puVar8;
  uint *puVar9;
  undefined1 *puVar10;
  ulong uVar11;
  uint uVar12;
  int *piVar13;
  long lVar14;
  bool bVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined4 uVar28;
  undefined4 uVar29;
  double dVar30;
  double dVar31;
  uint32_t monogram_histo [3];
  uint32_t combined_histo [32];
  uint32_t bigram_prefix_histo [9];
  double local_7d0;
  undefined1 local_7c8 [16];
  double local_7b8;
  uint local_798 [4];
  undefined1 local_788 [16];
  uint8_t *local_770;
  size_t local_768;
  int local_75c;
  ulong local_758;
  double local_750;
  long local_748;
  size_t local_740;
  uint local_738 [32];
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined4 local_698;
  
  local_75c = quality;
  if (length < 0x40 || quality < 5) {
    return;
  }
  if (0xfffff < size_hint) {
    uVar18 = length + start_pos;
    local_738[0x1c] = 0;
    local_738[0x1d] = 0;
    local_738[0x1e] = 0;
    local_738[0x1f] = 0;
    local_738[0x18] = 0;
    local_738[0x19] = 0;
    local_738[0x1a] = 0;
    local_738[0x1b] = 0;
    local_738[0x14] = 0;
    local_738[0x15] = 0;
    local_738[0x16] = 0;
    local_738[0x17] = 0;
    local_738[0x10] = 0;
    local_738[0x11] = 0;
    local_738[0x12] = 0;
    local_738[0x13] = 0;
    local_738[0xc] = 0;
    local_738[0xd] = 0;
    local_738[0xe] = 0;
    local_738[0xf] = 0;
    local_738[8] = 0;
    local_738[9] = 0;
    local_738[10] = 0;
    local_738[0xb] = 0;
    local_738[4] = 0;
    local_738[5] = 0;
    local_738[6] = 0;
    local_738[7] = 0;
    local_738[0] = 0;
    local_738[1] = 0;
    local_738[2] = 0;
    local_738[3] = 0;
    uVar12 = 0;
    local_740 = length;
    memset(&local_6b8,0,0x680);
    local_758 = start_pos;
    uVar7 = start_pos + 0x40;
    local_7c8 = ZEXT816(0);
    local_750 = 0.0;
    if (uVar7 <= uVar18) {
      do {
        if (start_pos + 2 < uVar7) {
          lVar14 = 2;
          bVar3 = input[start_pos + 1 & mask];
          bVar4 = input[start_pos & mask];
          do {
            bVar2 = bVar3;
            bVar3 = input[start_pos + lVar14 & mask];
            bVar4 = ShouldUseComplexStaticContextMap_kStaticContextMapComplexUTF8
                    [(ulong)(""[(ulong)bVar4 + 0x500] | ""[(ulong)bVar2 + 0x400]) * 4];
            uVar11 = (ulong)(bVar3 >> 3);
            local_738[uVar11] = local_738[uVar11] + 1;
            piVar13 = (int *)((long)&local_6b8 + uVar11 * 4 + (ulong)bVar4 * 0x80);
            *piVar13 = *piVar13 + 1;
            lVar14 = lVar14 + 1;
            bVar4 = bVar2;
          } while (lVar14 != 0x40);
          uVar12 = uVar12 + 0x3e;
        }
        start_pos = start_pos + 0x1000;
        uVar7 = uVar7 + 0x1000;
      } while (uVar7 <= uVar18);
      local_750 = (double)uVar12;
    }
    local_770 = input;
    local_768 = mask;
    uVar18 = 0xfffffffffffffff8;
    uVar7 = 0;
    do {
      uVar11 = (ulong)*(uint *)((long)local_738 + uVar18 + 8);
      if (uVar11 < 0x100) {
        dVar21 = (double)kLog2Table[uVar11];
      }
      else {
        dVar21 = log2((double)uVar11);
      }
      uVar16 = (ulong)*(uint *)((long)local_738 + uVar18 + 0xc);
      if (uVar16 < 0x100) {
        dVar19 = (double)kLog2Table[uVar16];
      }
      else {
        dVar19 = log2((double)uVar16);
      }
      uVar28 = local_7c8._8_4_;
      uVar29 = local_7c8._12_4_;
      uVar7 = uVar7 + uVar11 + uVar16;
      local_7c8._0_8_ = (local_7c8._0_8_ - (double)uVar11 * dVar21) - (double)uVar16 * dVar19;
      local_7c8._8_4_ = uVar28;
      local_7c8._12_4_ = uVar29;
      uVar18 = uVar18 + 8;
    } while (uVar18 < 0x78);
    if (uVar7 != 0) {
      auVar22._8_4_ = (int)(uVar7 >> 0x20);
      auVar22._0_8_ = uVar7;
      auVar22._12_4_ = 0x45300000;
      dVar21 = (auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
      if (uVar7 < 0x100) {
        dVar19 = (double)kLog2Table[uVar7];
      }
      else {
        dVar19 = log2(dVar21);
      }
      local_7c8._0_8_ = (double)local_7c8._0_8_ + dVar21 * dVar19;
    }
    dVar21 = 0.0;
    lVar14 = (long)&local_6b8 + 4;
    lVar17 = 0;
    do {
      local_748 = lVar17;
      uVar18 = 0xfffffffffffffff8;
      dVar19 = 0.0;
      uVar7 = 0;
      do {
        uVar11 = (ulong)*(uint *)(lVar14 + 4 + uVar18);
        if (uVar11 < 0x100) {
          dVar30 = (double)kLog2Table[uVar11];
        }
        else {
          dVar30 = log2((double)uVar11);
        }
        uVar16 = (ulong)*(uint *)(lVar14 + 8 + uVar18);
        dVar31 = (double)uVar16;
        if (uVar16 < 0x100) {
          dVar20 = (double)kLog2Table[uVar16];
        }
        else {
          local_788._0_8_ = dVar31;
          dVar20 = log2(dVar31);
          dVar31 = (double)local_788._0_8_;
        }
        lVar17 = local_748;
        uVar7 = uVar7 + uVar11 + uVar16;
        dVar19 = (dVar19 - (double)uVar11 * dVar30) - dVar31 * dVar20;
        uVar18 = uVar18 + 8;
      } while (uVar18 < 0x78);
      if (uVar7 != 0) {
        auVar23._8_4_ = (int)(uVar7 >> 0x20);
        auVar23._0_8_ = uVar7;
        auVar23._12_4_ = 0x45300000;
        dVar30 = (auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
        if (uVar7 < 0x100) {
          dVar31 = (double)kLog2Table[uVar7];
        }
        else {
          dVar31 = log2(dVar30);
        }
        dVar19 = dVar19 + dVar30 * dVar31;
      }
      dVar21 = dVar21 + dVar19;
      lVar17 = lVar17 + 1;
      lVar14 = lVar14 + 0x80;
    } while (lVar17 != 0xd);
    dVar21 = dVar21 * (1.0 / local_750);
    length = local_740;
    start_pos = local_758;
    input = local_770;
    mask = local_768;
    if ((dVar21 <= 3.0) && (0.2 <= (1.0 / local_750) * (double)local_7c8._0_8_ - dVar21)) {
      *num_literal_contexts = 0xd;
      puVar10 = ShouldUseComplexStaticContextMap_kStaticContextMapComplexUTF8;
      goto LAB_00129f4b;
    }
  }
  uVar18 = length + start_pos;
  local_6a8 = 0;
  uStack_6a0 = 0;
  local_6b8 = 0;
  uStack_6b0 = 0;
  local_698 = 0;
  for (uVar7 = start_pos + 0x40; uVar7 <= uVar18; uVar7 = uVar7 + 0x1000) {
    if (start_pos + 1 < uVar7) {
      piVar13 = DecideOverLiteralContextModeling::lut + (input[start_pos & mask] >> 6);
      lVar14 = 1;
      do {
        iVar5 = *piVar13;
        piVar13 = DecideOverLiteralContextModeling::lut + (input[start_pos + lVar14 & mask] >> 6);
        piVar1 = (int *)((long)&local_6b8 + ((long)*piVar13 + (long)iVar5 * 3) * 4);
        *piVar1 = *piVar1 + 1;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x40);
    }
    start_pos = start_pos + 0x1000;
  }
  puVar9 = local_798 + 1;
  uVar7 = 0;
  local_798[0] = 0;
  local_798[1] = 0;
  local_798[2] = 0;
  local_738[4] = 0;
  local_738[5] = 0;
  local_738[0] = 0;
  local_738[1] = 0;
  local_738[2] = 0;
  local_738[3] = 0;
  do {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar7;
    uVar18 = SUB168(auVar6 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2;
    iVar5 = *(int *)((long)&local_6b8 + uVar7 * 4);
    piVar13 = (int *)((long)local_798 + uVar7 * 4 + (uVar18 & 0xfffffffffffffffc) * -3);
    *piVar13 = *piVar13 + iVar5;
    piVar13 = (int *)((long)local_738 + uVar7 * 4 + (uVar18 & 0xfffffffffffffff8) * -3);
    *piVar13 = *piVar13 + iVar5;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 9);
  bVar15 = true;
  puVar8 = local_798;
  dVar21 = 0.0;
  uVar28 = 0;
  uVar29 = 0;
  lVar14 = 0;
  while( true ) {
    uVar7 = (ulong)*puVar8;
    if (uVar7 < 0x100) {
      dVar19 = (double)kLog2Table[uVar7];
    }
    else {
      local_788._8_4_ = uVar28;
      local_788._0_8_ = dVar21;
      local_788._12_4_ = uVar29;
      dVar19 = log2((double)uVar7);
      dVar21 = local_788._0_8_;
      uVar28 = local_788._8_4_;
      uVar29 = local_788._12_4_;
    }
    uVar18 = lVar14 + uVar7;
    dVar21 = dVar21 - (double)uVar7 * dVar19;
    if (!bVar15) break;
    uVar7 = (ulong)*puVar9;
    if (uVar7 < 0x100) {
      dVar19 = (double)kLog2Table[uVar7];
    }
    else {
      local_788._8_4_ = uVar28;
      local_788._0_8_ = dVar21;
      local_788._12_4_ = uVar29;
      dVar19 = log2((double)uVar7);
      dVar21 = local_788._0_8_;
      uVar28 = local_788._8_4_;
      uVar29 = local_788._12_4_;
    }
    lVar14 = uVar18 + uVar7;
    dVar21 = dVar21 - (double)uVar7 * dVar19;
    bVar15 = false;
    puVar8 = local_798 + 2;
    puVar9 = local_798 + 3;
  }
  if (uVar18 != 0) {
    auVar24._8_4_ = (int)(uVar18 >> 0x20);
    auVar24._0_8_ = uVar18;
    auVar24._12_4_ = 0x45300000;
    dVar19 = (auVar24._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0);
    if (uVar18 < 0x100) {
      dVar30 = (double)kLog2Table[uVar18];
    }
    else {
      local_788._8_4_ = uVar28;
      local_788._0_8_ = dVar21;
      local_788._12_4_ = uVar29;
      dVar30 = log2(dVar19);
      dVar21 = local_788._0_8_;
      uVar28 = local_788._8_4_;
      uVar29 = local_788._12_4_;
    }
    dVar21 = dVar21 + dVar19 * dVar30;
  }
  local_788._8_4_ = uVar28;
  local_788._0_8_ = dVar21;
  local_788._12_4_ = uVar29;
  bVar15 = true;
  local_7b8 = 0.0;
  lVar14 = 0;
  puVar9 = local_738;
  puVar8 = local_738 + 1;
  while( true ) {
    uVar7 = (ulong)*puVar9;
    if (uVar7 < 0x100) {
      dVar21 = (double)kLog2Table[uVar7];
    }
    else {
      dVar21 = log2((double)uVar7);
    }
    uVar18 = lVar14 + uVar7;
    local_7b8 = local_7b8 - (double)uVar7 * dVar21;
    if (!bVar15) break;
    uVar7 = (ulong)*puVar8;
    if (uVar7 < 0x100) {
      dVar21 = (double)kLog2Table[uVar7];
    }
    else {
      dVar21 = log2((double)uVar7);
    }
    lVar14 = uVar18 + uVar7;
    local_7b8 = local_7b8 - (double)uVar7 * dVar21;
    bVar15 = false;
    puVar9 = local_738 + 2;
    puVar8 = local_738 + 3;
  }
  if (uVar18 != 0) {
    auVar25._8_4_ = (int)(uVar18 >> 0x20);
    auVar25._0_8_ = uVar18;
    auVar25._12_4_ = 0x45300000;
    dVar21 = (auVar25._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0);
    if (uVar18 < 0x100) {
      dVar19 = (double)kLog2Table[uVar18];
    }
    else {
      dVar19 = log2(dVar21);
    }
    local_7b8 = local_7b8 + dVar21 * dVar19;
  }
  uVar7 = 0xc;
  dVar21 = 0.0;
  lVar14 = 0;
  while( true ) {
    uVar18 = (ulong)*(uint *)((long)local_738 + uVar7);
    if (uVar18 < 0x100) {
      dVar19 = (double)kLog2Table[uVar18];
    }
    else {
      dVar19 = log2((double)uVar18);
    }
    uVar11 = lVar14 + uVar18;
    dVar21 = dVar21 - (double)uVar18 * dVar19;
    if (0x13 < uVar7) break;
    uVar18 = (ulong)*(uint *)((long)local_738 + uVar7 + 4);
    if (uVar18 < 0x100) {
      dVar19 = (double)kLog2Table[uVar18];
    }
    else {
      dVar19 = log2((double)uVar18);
    }
    lVar14 = uVar11 + uVar18;
    dVar21 = dVar21 - (double)uVar18 * dVar19;
    uVar7 = uVar7 + 8;
  }
  if (uVar11 != 0) {
    auVar26._8_4_ = (int)(uVar11 >> 0x20);
    auVar26._0_8_ = uVar11;
    auVar26._12_4_ = 0x45300000;
    dVar19 = (auVar26._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
    if (uVar11 < 0x100) {
      dVar30 = (double)kLog2Table[uVar11];
    }
    else {
      dVar30 = log2(dVar19);
    }
    dVar21 = dVar21 + dVar19 * dVar30;
  }
  local_7d0 = 0.0;
  lVar14 = 0;
  do {
    bVar15 = true;
    lVar17 = 0;
    dVar19 = 0.0;
    uVar7 = 0;
    while( true ) {
      uVar18 = (ulong)*(uint *)((long)&local_6b8 + uVar7 + lVar14 * 0xc);
      if (uVar18 < 0x100) {
        dVar30 = (double)kLog2Table[uVar18];
      }
      else {
        dVar30 = log2((double)uVar18);
      }
      uVar11 = lVar17 + uVar18;
      dVar19 = dVar19 - (double)uVar18 * dVar30;
      if (!bVar15) break;
      uVar7 = (ulong)*(uint *)((long)&local_6b8 + (uVar7 | 4) + lVar14 * 0xc);
      if (uVar7 < 0x100) {
        dVar30 = (double)kLog2Table[uVar7];
      }
      else {
        dVar30 = log2((double)uVar7);
      }
      lVar17 = uVar11 + uVar7;
      dVar19 = dVar19 - (double)uVar7 * dVar30;
      uVar7 = 8;
      bVar15 = false;
    }
    if (uVar11 != 0) {
      auVar27._8_4_ = (int)(uVar11 >> 0x20);
      auVar27._0_8_ = uVar11;
      auVar27._12_4_ = 0x45300000;
      dVar30 = (auVar27._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
      if (uVar11 < 0x100) {
        dVar31 = (double)kLog2Table[uVar11];
      }
      else {
        dVar31 = log2(dVar30);
      }
      dVar19 = dVar19 + dVar30 * dVar31;
    }
    local_7d0 = local_7d0 + dVar19;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  dVar30 = 1.0 / (double)(local_798[1] + local_798[0] + local_798[2]);
  dVar19 = (double)local_788._0_8_ * dVar30;
  dVar21 = (local_7b8 + dVar21) * dVar30;
  if (local_75c < 7) {
    local_7d0 = dVar19 * 10.0;
  }
  else {
    local_7d0 = local_7d0 * dVar30;
  }
  if ((dVar19 - dVar21 < 0.2) && (dVar19 - local_7d0 < 0.2)) {
    *num_literal_contexts = 1;
    return;
  }
  if (0.02 <= dVar21 - local_7d0) {
    *num_literal_contexts = 3;
    puVar10 = ChooseContextMap_kStaticContextMapContinuation;
  }
  else {
    *num_literal_contexts = 2;
    puVar10 = ChooseContextMap_kStaticContextMapSimpleUTF8;
  }
LAB_00129f4b:
  *literal_context_map = (uint32_t *)puVar10;
  return;
}

Assistant:

static void DecideOverLiteralContextModeling(const uint8_t* input,
    size_t start_pos, size_t length, size_t mask, int quality, size_t size_hint,
    size_t* num_literal_contexts, const uint32_t** literal_context_map) {
  if (quality < MIN_QUALITY_FOR_CONTEXT_MODELING || length < 64) {
    return;
  } else if (ShouldUseComplexStaticContextMap(
      input, start_pos, length, mask, quality, size_hint,
      num_literal_contexts, literal_context_map)) {
    /* Context map was already set, nothing else to do. */
  } else {
    /* Gather bi-gram data of the UTF8 byte prefixes. To make the analysis of
       UTF8 data faster we only examine 64 byte long strides at every 4kB
       intervals. */
    const size_t end_pos = start_pos + length;
    uint32_t bigram_prefix_histo[9] = { 0 };
    for (; start_pos + 64 <= end_pos; start_pos += 4096) {
      static const int lut[4] = { 0, 0, 1, 2 };
      const size_t stride_end_pos = start_pos + 64;
      int prev = lut[input[start_pos & mask] >> 6] * 3;
      size_t pos;
      for (pos = start_pos + 1; pos < stride_end_pos; ++pos) {
        const uint8_t literal = input[pos & mask];
        ++bigram_prefix_histo[prev + lut[literal >> 6]];
        prev = lut[literal >> 6] * 3;
      }
    }
    ChooseContextMap(quality, &bigram_prefix_histo[0], num_literal_contexts,
                     literal_context_map);
  }
}